

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

settings_r * open_settings_r(char *sessionname)

{
  char *pcVar1;
  FILE *__stream;
  tree234 *ptVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 *e;
  char *__s;
  skeyval *kv;
  char *value;
  settings_r *toret;
  char *line;
  FILE *fp;
  char *filename;
  char *sessionname_local;
  
  pcVar1 = make_filename(5,sessionname);
  __stream = fopen(pcVar1,"r");
  safefree(pcVar1);
  if (__stream == (FILE *)0x0) {
    sessionname_local = (char *)0x0;
  }
  else {
    sessionname_local = (char *)safemalloc(1,8,0);
    ptVar2 = newtree234(keycmp);
    *(tree234 **)sessionname_local = ptVar2;
    while( true ) {
      pcVar1 = fgetline((FILE *)__stream);
      if (pcVar1 == (char *)0x0) break;
      pcVar3 = strchr(pcVar1,0x3d);
      if (pcVar3 == (char *)0x0) {
        safefree(pcVar1);
      }
      else {
        __s = pcVar3 + 1;
        *pcVar3 = '\0';
        sVar4 = strcspn(__s,"\r\n");
        __s[sVar4] = '\0';
        e = (undefined8 *)safemalloc(1,0x10,0);
        pcVar3 = dupstr(pcVar1);
        *e = pcVar3;
        pcVar3 = dupstr(__s);
        e[1] = pcVar3;
        add234(*(tree234 **)sessionname_local,e);
        safefree(pcVar1);
      }
    }
    fclose(__stream);
  }
  return (settings_r *)sessionname_local;
}

Assistant:

settings_r *open_settings_r(const char *sessionname)
{
    char *filename;
    FILE *fp;
    char *line;
    settings_r *toret;

    filename = make_filename(INDEX_SESSION, sessionname);
    fp = fopen(filename, "r");
    sfree(filename);
    if (!fp)
        return NULL;                   /* can't open */

    toret = snew(settings_r);
    toret->t = newtree234(keycmp);

    while ( (line = fgetline(fp)) ) {
        char *value = strchr(line, '=');
        struct skeyval *kv;

        if (!value) {
            sfree(line);
            continue;
        }
        *value++ = '\0';
        value[strcspn(value, "\r\n")] = '\0';   /* trim trailing NL */

        kv = snew(struct skeyval);
        kv->key = dupstr(line);
        kv->value = dupstr(value);
        add234(toret->t, kv);

        sfree(line);
    }

    fclose(fp);

    return toret;
}